

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O3

string * cmQtAutoGen::QuotedCommand
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *command)

{
  string *psVar1;
  size_type sVar2;
  long lVar3;
  string *psVar4;
  char *in_RCX;
  string *psVar5;
  string_view text;
  string cesc;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar5 = (command->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (command->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar5 != psVar1) {
    do {
      if (__return_storage_ptr__->_M_string_length != 0) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      text._M_str = in_RCX;
      text._M_len = (size_t)(psVar5->_M_dataplus)._M_p;
      Quoted_abi_cxx11_(&local_50,(cmQtAutoGen *)psVar5->_M_string_length,text);
      sVar2 = psVar5->_M_string_length;
      in_RCX = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),sVar2 == 0);
      psVar4 = &local_50;
      if ((local_50._M_string_length <= sVar2 + 2 && sVar2 != 0) &&
         (lVar3 = std::__cxx11::string::find((char)&local_50,0x20), psVar4 = psVar5, lVar3 != -1)) {
        psVar4 = &local_50;
      }
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(psVar4->_M_dataplus)._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      psVar5 = psVar5 + 1;
    } while (psVar5 != psVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::QuotedCommand(std::vector<std::string> const& command)
{
  std::string res;
  for (std::string const& item : command) {
    if (!res.empty()) {
      res.push_back(' ');
    }
    std::string const cesc = cmQtAutoGen::Quoted(item);
    if (item.empty() || (cesc.size() > (item.size() + 2)) ||
        (cesc.find(' ') != std::string::npos)) {
      res += cesc;
    } else {
      res += item;
    }
  }
  return res;
}